

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

node_t_conflict cond_expr(c2m_ctx_t c2m_ctx,int no_err_p)

{
  int iVar1;
  node_t_conflict pnVar2;
  node_t_conflict pnVar3;
  node *pnVar4;
  pos_t pos;
  
  pnVar2 = left_op(c2m_ctx,no_err_p,0x10b,-1,land_expr);
  pnVar4 = &err_struct;
  if ((pnVar2 != &err_struct) &&
     (iVar1 = match(c2m_ctx,0x3f,&pos,(node_code_t *)0x0,(node_t_conflict *)0x0), pnVar4 = pnVar2,
     iVar1 != 0)) {
    pnVar2 = new_pos_node1(c2m_ctx,N_COND,pos,pnVar2);
    pnVar3 = expr(c2m_ctx,no_err_p);
    pnVar4 = &err_struct;
    if (pnVar3 != &err_struct) {
      op_append(c2m_ctx,pnVar2,pnVar3);
      iVar1 = match(c2m_ctx,0x3a,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
      if (iVar1 != 0) {
        pnVar3 = cond_expr(c2m_ctx,no_err_p);
        pnVar4 = &err_struct;
        if (pnVar3 != &err_struct) {
          op_append(c2m_ctx,pnVar2,pnVar3);
          pnVar4 = pnVar2;
        }
      }
    }
  }
  return pnVar4;
}

Assistant:

D (cond_expr) {
  node_t r, n;
  pos_t pos;

  P (lor_expr);
  if (!MP ('?', pos)) return r;
  n = new_pos_node1 (c2m_ctx, N_COND, pos, r);
  P (expr);
  op_append (c2m_ctx, n, r);
  if (!M (':')) return err_node;
  P (cond_expr);
  op_append (c2m_ctx, n, r);
  return n;
}